

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_enable_universal_weight(mcpl_outfile_t of,double w)

{
  double dVar1;
  char *pcVar2;
  
  dVar1 = ABS(w);
  if ((uint)((long)dVar1 + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)w < 0 ||
      ((dVar1 == INFINITY || (dVar1 == 0.0 || 0x7fefffffffffffff < (ulong)dVar1)) ||
      (long)dVar1 - 1U < 0xfffffffffffff && (long)w < 0)) {
    pcVar2 = "mcpl_enable_universal_weight must be called with positive but finite weight.";
  }
  else {
    dVar1 = *(double *)((long)of.internal + 0x58);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if ((dVar1 == w) && (!NAN(dVar1) && !NAN(w))) {
        return;
      }
      pcVar2 = "mcpl_enable_universal_weight called multiple times";
    }
    else {
      if (*(int *)((long)of.internal + 0x60) != 0) {
        *(double *)((long)of.internal + 0x58) = w;
        mcpl_recalc_psize(of);
        return;
      }
      pcVar2 = "mcpl_enable_universal_weight called too late.";
    }
  }
  (*mcpl_error_handler)(pcVar2);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_enable_universal_weight(mcpl_outfile_t of, double w)
{
  MCPLIMP_OUTFILEDECODE;
  if (w<=0.0||isinf(w)||isnan(w))
    mcpl_error("mcpl_enable_universal_weight must be called with positive but finite weight.");
  if (f->opt_universalweight) {
    if (f->opt_universalweight!=w)
      mcpl_error("mcpl_enable_universal_weight called multiple times");
    return;
  }
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_universal_weight called too late.");
  f->opt_universalweight = w;
  mcpl_recalc_psize(of);
}